

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportScriptPubKeys
          (LegacyScriptPubKeyMan *this,
          set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys,
          bool have_solving_data,int64_t timestamp)

{
  long lVar1;
  bool bVar2;
  reference dest;
  LegacyScriptPubKeyMan *in_RCX;
  byte in_DL;
  WalletBatch *in_RSI;
  WalletBatch *in_RDI;
  long in_FS_OFFSET;
  CScript *script;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *__range1;
  iterator __end1;
  iterator __begin1;
  WalletBatch batch;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined2 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff82;
  undefined1 in_stack_ffffffffffffff83;
  int in_stack_ffffffffffffff84;
  int64_t in_stack_ffffffffffffff98;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (*in_RDI->m_database->_vptr_WalletDatabase[3])();
  WalletBatch::WalletBatch
            (in_RDI,(WalletDatabase *)
                    CONCAT44(in_stack_ffffffffffffff84,
                             CONCAT13(in_stack_ffffffffffffff83,
                                      CONCAT12(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80))
                            ),(bool)in_stack_ffffffffffffff7f);
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::begin
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
             CONCAT44(in_stack_ffffffffffffff84,
                      CONCAT13(in_stack_ffffffffffffff83,
                               CONCAT12(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80))));
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::end
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
             CONCAT44(in_stack_ffffffffffffff84,
                      CONCAT13(in_stack_ffffffffffffff83,
                               CONCAT12(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80))));
  do {
    bVar2 = std::operator==((_Self *)in_RDI,
                            (_Self *)CONCAT44(in_stack_ffffffffffffff84,
                                              CONCAT13(in_stack_ffffffffffffff83,
                                                       CONCAT12(in_stack_ffffffffffffff82,
                                                                in_stack_ffffffffffffff80))));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_29 = true;
LAB_003fd119:
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_29;
    }
    dest = std::_Rb_tree_const_iterator<CScript>::operator*
                     ((_Rb_tree_const_iterator<CScript> *)
                      CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if ((((in_DL & 1) == 0) ||
        (in_stack_ffffffffffffff84 =
              (*(code *)(in_RDI->m_batch)._M_t.
                        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl[3].
                        _vptr_DatabaseBatch)(in_RDI,dest), in_stack_ffffffffffffff84 == 0)) &&
       (in_stack_ffffffffffffff83 = AddWatchOnlyWithDB(in_RCX,in_RSI,dest,in_stack_ffffffffffffff98)
       , !(bool)in_stack_ffffffffffffff83)) {
      local_29 = false;
      goto LAB_003fd119;
    }
    std::_Rb_tree_const_iterator<CScript>::operator++
              ((_Rb_tree_const_iterator<CScript> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  } while( true );
}

Assistant:

bool LegacyScriptPubKeyMan::ImportScriptPubKeys(const std::set<CScript>& script_pub_keys, const bool have_solving_data, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const CScript& script : script_pub_keys) {
        if (!have_solving_data || !IsMine(script)) { // Always call AddWatchOnly for non-solvable watch-only, so that watch timestamp gets updated
            if (!AddWatchOnlyWithDB(batch, script, timestamp)) {
                return false;
            }
        }
    }
    return true;
}